

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_bases.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ZeroFieldsBase::InternalSwap(ZeroFieldsBase *this,ZeroFieldsBase *other)

{
  ulong uVar1;
  UnknownFieldSet *other_00;
  
  uVar1 = (other->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    if ((uVar1 & 1) == 0) {
      return;
    }
  }
  else if ((uVar1 & 1) == 0) {
    other_00 = InternalMetadata::mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>
                         (&(other->super_Message).super_MessageLite._internal_metadata_);
    goto LAB_00250c41;
  }
  other_00 = (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8);
LAB_00250c41:
  InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
  return;
}

Assistant:

void ZeroFieldsBase::InternalSwap(ZeroFieldsBase* other) {
  _internal_metadata_.Swap<UnknownFieldSet>(&other->_internal_metadata_);
}